

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue_generic_tester.h
# Opt level: O1

void __thiscall
density_tests::
QueueGenericTester<density::sp_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_density::default_busy_wait>_>
::ThreadData::handle_pending_consume(ThreadData *this,size_t i_pending_consume_index)

{
  long *plVar1;
  long lVar2;
  result_type_conflict rVar3;
  long lVar4;
  reentrant_consume_operation *this_00;
  param_type local_30;
  
  lVar4 = i_pending_consume_index * 0x20;
  lVar2 = *(long *)(*(long *)(this + 0x1408) + 0x18 + lVar4);
  this_00 = (reentrant_consume_operation *)(*(long *)(this + 0x1408) + lVar4);
  (**(code **)(*(long *)(*(long *)(this + 8) + 0x88) + lVar2 * 8))(this_00);
  local_30._M_a = 0;
  local_30._M_b = 1;
  rVar3 = std::uniform_int_distribution<int>::operator()
                    ((uniform_int_distribution<int> *)&local_30,
                     (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                      *)(this + 0x50),&local_30);
  if (rVar3 == 0) {
    density::
    sp_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_density::default_busy_wait>
    ::reentrant_consume_operation::commit(this_00);
    plVar1 = (long *)(*(long *)(this + 0x20) + lVar2 * 0x10);
    *plVar1 = *plVar1 + -1;
    *(long *)(this + 0x13e8) = *(long *)(this + 0x13e8) + 1;
  }
  else {
    density::
    sp_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_density::default_busy_wait>
    ::reentrant_consume_operation::cancel(this_00);
  }
  std::
  vector<density_tests::QueueGenericTester<density::sp_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_density::default_busy_wait>_>::ThreadData::ReentrantConsume,_std::allocator<density_tests::QueueGenericTester<density::sp_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_density::default_busy_wait>_>::ThreadData::ReentrantConsume>_>
  ::_M_erase((vector<density_tests::QueueGenericTester<density::sp_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_density::default_busy_wait>_>::ThreadData::ReentrantConsume,_std::allocator<density_tests::QueueGenericTester<density::sp_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_density::default_busy_wait>_>::ThreadData::ReentrantConsume>_>
              *)(this + 0x1408),(ReentrantConsume *)(lVar4 + *(long *)(this + 0x1408)));
  return;
}

Assistant:

void handle_pending_consume(size_t const i_pending_consume_index)
            {
                // commit or cancel a reentrant consume
                auto &     pending_consume = m_pending_reentrant_consumes[i_pending_consume_index];
                auto const type_index      = pending_consume.m_type_index;

                (*m_parent_tester.m_reentrant_consume_cases[type_index])(
                  pending_consume.m_operation);

                if (m_random.get_bool())
                {
                    pending_consume.m_operation.commit();
                    m_final_stats.m_counters[type_index].m_existing--;
                    m_consumes_committed++;
                }
                else
                {
                    pending_consume.m_operation.cancel();
                }

                m_pending_reentrant_consumes.erase(
                  m_pending_reentrant_consumes.begin() + i_pending_consume_index);
            }